

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringBuilder.hpp
# Opt level: O0

undefined8
StringBuilder<int,char_const(&)[5],int,char_const(&)[5],int_const&,char_const(&)[4]>
          (int *arg,char (*args) [5],int *args_1,char (*args_2) [5],int *args_3,char (*args_4) [4])

{
  int *in_RCX;
  char (*in_RDX) [5];
  undefined8 in_RDI;
  char (*in_R8) [5];
  int *in_R9;
  int *in_stack_ffffffffffffff68;
  string local_70 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa8;
  string local_50 [24];
  char (*in_stack_ffffffffffffffc8) [4];
  
  StringBuilder<int>(in_stack_ffffffffffffff68);
  StringBuilder<char[5],int,char_const(&)[5],int_const&,char_const(&)[4]>
            (in_RDX,in_RCX,in_R8,in_R9,in_stack_ffffffffffffffc8);
  std::operator+(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::~string(local_50);
  return in_RDI;
}

Assistant:

std::string StringBuilder(const T & arg, Targs && ... args)
{
    return StringBuilder(arg) + StringBuilder(std::forward<Targs>(args)...);
}